

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigNode.c
# Opt level: O0

Fraig_Node_t * Fraig_NodeCreate(Fraig_Man_t *p,Fraig_Node_t *p1,Fraig_Node_t *p2)

{
  int iVar1;
  Fraig_Node_t *Entry;
  abctime aVar2;
  uint *puVar3;
  abctime aVar4;
  uint local_3c;
  uint local_34;
  abctime clk;
  Fraig_Node_t *pNode;
  Fraig_Node_t *p2_local;
  Fraig_Node_t *p1_local;
  Fraig_Man_t *p_local;
  
  Entry = (Fraig_Node_t *)Fraig_MemFixedEntryFetch(p->mmNodes);
  memset(Entry,0,0xa0);
  Entry->p1 = p1;
  *(int *)(((ulong)p1 & 0xfffffffffffffffe) + 0xc) =
       *(int *)(((ulong)p1 & 0xfffffffffffffffe) + 0xc) + 1;
  Entry->p2 = p2;
  *(int *)(((ulong)p2 & 0xfffffffffffffffe) + 0xc) =
       *(int *)(((ulong)p2 & 0xfffffffffffffffe) + 0xc) + 1;
  Entry->Num = p->vNodes->nSize;
  Fraig_NodeVecPush(p->vNodes,Entry);
  Entry->NumPi = -1;
  iVar1 = Abc_MaxInt(*(int *)(((ulong)p1 & 0xfffffffffffffffe) + 8),
                     *(int *)(((ulong)p2 & 0xfffffffffffffffe) + 8));
  Entry->Level = iVar1 + 1;
  if (((ulong)p1 & 1) == 0) {
    local_34 = *(uint *)&p1->field_0x18 & 1;
  }
  else {
    local_34 = (uint)(((*(uint *)(((ulong)p1 & 0xfffffffffffffffe) + 0x18) & 1) != 0 ^ 0xffU) & 1);
  }
  if (((ulong)p2 & 1) == 0) {
    local_3c = *(uint *)&p2->field_0x18 & 1;
  }
  else {
    local_3c = (uint)(((*(uint *)(((ulong)p2 & 0xfffffffffffffffe) + 0x18) & 1) != 0 ^ 0xffU) & 1);
  }
  *(uint *)&Entry->field_0x18 = *(uint *)&Entry->field_0x18 & 0xfffffffe | local_34 & local_3c;
  *(uint *)&Entry->field_0x18 =
       *(uint *)&Entry->field_0x18 & 0xfffffdff |
       (*(uint *)(((ulong)p1 & 0xfffffffffffffffe) + 0x18) >> 9 & 1 |
       *(uint *)(((ulong)p2 & 0xfffffffffffffffe) + 0x18) >> 9 & 1) << 9;
  aVar2 = Abc_Clock();
  puVar3 = (uint *)Fraig_MemFixedEntryFetch(p->mmSims);
  Entry->puSimR = puVar3;
  Entry->puSimD = Entry->puSimR + p->nWordsRand;
  Entry->uHashR = 0;
  Fraig_NodeSimulate(Entry,0,p->nWordsRand,1);
  Entry->uHashD = 0;
  Fraig_NodeSimulate(Entry,0,p->iWordStart,0);
  iVar1 = Fraig_BitStringCountOnes(Entry->puSimR,p->nWordsRand);
  *(uint *)&Entry->field_0x18 = *(uint *)&Entry->field_0x18 & 0xfff | iVar1 << 0xc;
  if ((*(uint *)&Entry->field_0x18 & 1) != 0) {
    *(uint *)&Entry->field_0x18 =
         *(uint *)&Entry->field_0x18 & 0xfff |
         (p->nWordsRand * 0x20 - (*(uint *)&Entry->field_0x18 >> 0xc)) * 0x1000;
  }
  aVar4 = Abc_Clock();
  p->timeSims = (aVar4 - aVar2) + p->timeSims;
  Fraig_NodeAddFaninFanout((Fraig_Node_t *)((ulong)p1 & 0xfffffffffffffffe),Entry);
  Fraig_NodeAddFaninFanout((Fraig_Node_t *)((ulong)p2 & 0xfffffffffffffffe),Entry);
  return Entry;
}

Assistant:

Fraig_Node_t * Fraig_NodeCreate( Fraig_Man_t * p, Fraig_Node_t * p1, Fraig_Node_t * p2 )
{
    Fraig_Node_t * pNode;
    abctime clk;

    // create the node
    pNode = (Fraig_Node_t *)Fraig_MemFixedEntryFetch( p->mmNodes );
    memset( pNode, 0, sizeof(Fraig_Node_t) );

    // assign the children
    pNode->p1  = p1;  Fraig_Ref(p1);  Fraig_Regular(p1)->nRefs++;
    pNode->p2  = p2;  Fraig_Ref(p2);  Fraig_Regular(p2)->nRefs++;

    // assign the number and add to the array of nodes
    pNode->Num = p->vNodes->nSize;
    Fraig_NodeVecPush( p->vNodes,  pNode );

    // assign the PI number
    pNode->NumPi = -1;

    // compute the level of this node
    pNode->Level = 1 + Abc_MaxInt(Fraig_Regular(p1)->Level, Fraig_Regular(p2)->Level);
    pNode->fInv  = Fraig_NodeIsSimComplement(p1) & Fraig_NodeIsSimComplement(p2);
    pNode->fFailTfo = Fraig_Regular(p1)->fFailTfo | Fraig_Regular(p2)->fFailTfo;

    // derive the simulation info 
clk = Abc_Clock();
    // allocate memory for the simulation info
    pNode->puSimR = (unsigned *)Fraig_MemFixedEntryFetch( p->mmSims );
    pNode->puSimD = pNode->puSimR + p->nWordsRand;
    // derive random simulation info
    pNode->uHashR = 0;
    Fraig_NodeSimulate( pNode, 0, p->nWordsRand, 1 );
    // derive dynamic simulation info
    pNode->uHashD = 0;
    Fraig_NodeSimulate( pNode, 0, p->iWordStart, 0 );
    // count the number of ones in the random simulation info
    pNode->nOnes = Fraig_BitStringCountOnes( pNode->puSimR, p->nWordsRand );
    if ( pNode->fInv )
        pNode->nOnes = p->nWordsRand * 32 - pNode->nOnes;
    // add to the runtime of simulation
p->timeSims += Abc_Clock() - clk;

#ifdef FRAIG_ENABLE_FANOUTS
    // create the fanout info
    Fraig_NodeAddFaninFanout( Fraig_Regular(p1), pNode );
    Fraig_NodeAddFaninFanout( Fraig_Regular(p2), pNode );
#endif
    return pNode;
}